

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O2

string * __thiscall
flatbuffers::IdlNamer::Field(string *__return_storage_ptr__,IdlNamer *this,FieldDef *d,string *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)d,
                 "_");
  std::operator+(&local_60,&local_40,s);
  (*(this->super_Namer)._vptr_Namer[0x12])(__return_storage_ptr__,this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Field(const FieldDef &d, const std::string &s) const {
    return Field(d.name + "_" + s);
  }